

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mode.cpp
# Opt level: O3

void duckdb::TypedModeFunction<duckdb::ModeString>::
     ConstantOperation<duckdb::string_t,duckdb::ModeState<duckdb::string_t,duckdb::ModeString>,duckdb::EntropyFunction<duckdb::ModeString>>
               (ModeState<duckdb::string_t,_duckdb::ModeString> *state,string_t *key,
               AggregateUnaryInput *aggr_input,idx_t count)

{
  ArenaAllocator *pAVar1;
  ulong uVar2;
  Counts *this;
  mapped_type *pmVar3;
  ulong uVar4;
  
  this = state->frequency_map;
  if (this == (Counts *)0x0) {
    pAVar1 = aggr_input->input->allocator;
    this = (Counts *)operator_new(0x48);
    this->allocator = &pAVar1->arena_allocator;
    (this->map)._M_h._M_buckets = &(this->map)._M_h._M_single_bucket;
    (this->map)._M_h._M_bucket_count = 1;
    (this->map)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    (this->map)._M_h._M_element_count = 0;
    (this->map)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
    (this->map)._M_h._M_rehash_policy._M_next_resize = 0;
    (this->map)._M_h._M_single_bucket = (__node_base_ptr)0x0;
    this->free_type = DOES_NOT_REQUIRE_FREE;
    state->frequency_map = this;
  }
  pmVar3 = OwningStringMap<duckdb::ModeAttr,_std::unordered_map<duckdb::string_t,_duckdb::ModeAttr,_duckdb::StringHash,_duckdb::StringEquality,_std::allocator<std::pair<const_duckdb::string_t,_duckdb::ModeAttr>_>_>_>
           ::GetOrCreate(this,(key_type)(key->value).pointer);
  pmVar3->count = pmVar3->count + count;
  uVar2 = state->count;
  uVar4 = pmVar3->first_row;
  if (uVar2 <= pmVar3->first_row) {
    uVar4 = uVar2;
  }
  pmVar3->first_row = uVar4;
  state->count = uVar2 + count;
  return;
}

Assistant:

static void ConstantOperation(STATE &state, const INPUT_TYPE &key, AggregateUnaryInput &aggr_input, idx_t count) {
		if (!state.frequency_map) {
			state.frequency_map = TYPE_OP::CreateEmpty(aggr_input.input.allocator);
		}
		auto &i = (*state.frequency_map)[key];
		i.count += count;
		i.first_row = MinValue<idx_t>(i.first_row, state.count);
		state.count += count;
	}